

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3MatchinfoFunc(sqlite3_context *pContext,int nVal,sqlite3_value **apVal)

{
  int iVar1;
  uchar *local_30;
  char *zArg;
  Fts3Cursor *pCsr;
  sqlite3_value **apVal_local;
  sqlite3_context *psStack_10;
  int nVal_local;
  sqlite3_context *pContext_local;
  
  pCsr = (Fts3Cursor *)apVal;
  apVal_local._4_4_ = nVal;
  psStack_10 = pContext;
  iVar1 = fts3FunctionArg(pContext,"matchinfo",*apVal,(Fts3Cursor **)&zArg);
  if (iVar1 == 0) {
    local_30 = (uchar *)0x0;
    if (1 < apVal_local._4_4_) {
      local_30 = sqlite3_value_text(*(sqlite3_value **)&pCsr->eSearch);
    }
    sqlite3Fts3Matchinfo(psStack_10,(Fts3Cursor *)zArg,(char *)local_30);
  }
  return;
}

Assistant:

static void fts3MatchinfoFunc(
  sqlite3_context *pContext,      /* SQLite function call context */
  int nVal,                       /* Size of argument array */
  sqlite3_value **apVal           /* Array of arguments */
){
  Fts3Cursor *pCsr;               /* Cursor handle passed through apVal[0] */
  assert( nVal==1 || nVal==2 );
  if( SQLITE_OK==fts3FunctionArg(pContext, "matchinfo", apVal[0], &pCsr) ){
    const char *zArg = 0;
    if( nVal>1 ){
      zArg = (const char *)sqlite3_value_text(apVal[1]);
    }
    sqlite3Fts3Matchinfo(pContext, pCsr, zArg);
  }
}